

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_pileup1_t * bam_plp_next(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  int *piVar1;
  uint *puVar2;
  ushort uVar3;
  int iVar4;
  mempool_t *pmVar5;
  uint8_t *puVar6;
  __linkbuf_t *p_Var7;
  __linkbuf_t *p_Var8;
  char cVar9;
  lbnode_t **pplVar10;
  bam_pileup1_t *pbVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  lbnode_t *plVar17;
  int *piVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  lbnode_t *b;
  bam_pileup1_t *local_50;
  
  if (iter->error == 0) {
    *_n_plp = 0;
    if ((iter->is_eof == 0) || (iter->head->next != (__linkbuf_t *)0x0)) {
      do {
        if ((iter->is_eof == 0) && (iter->max_tid <= iter->tid)) {
          if (iter->max_tid != iter->tid) {
            return (bam_pileup1_t *)0x0;
          }
          if (iter->max_pos <= iter->pos) {
            return (bam_pileup1_t *)0x0;
          }
        }
        b = iter->head;
        plVar17 = iter->dummy;
        plVar17->next = b;
        if (b->next == (__linkbuf_t *)0x0) {
          iVar25 = 0;
        }
        else {
          iVar25 = 0;
          do {
            iVar13 = (b->b).core.tid;
            iVar12 = iter->tid;
            if (iVar13 < iVar12) {
LAB_00141988:
              overlap_remove(iter,&b->b);
              plVar17->next = b->next;
              pmVar5 = iter->mp;
              pmVar5->cnt = pmVar5->cnt + -1;
              b->next = (__linkbuf_t *)0x0;
              iVar13 = pmVar5->max;
              if (pmVar5->n == iVar13) {
                iVar12 = iVar13 * 2;
                if (iVar13 == 0) {
                  iVar12 = 0x100;
                }
                pmVar5->max = iVar12;
                pplVar10 = (lbnode_t **)realloc(pmVar5->buf,(long)iVar12 << 3);
                pmVar5->buf = pplVar10;
              }
              iVar13 = pmVar5->n;
              pmVar5->n = iVar13 + 1;
              pmVar5->buf[iVar13] = b;
              b = plVar17;
            }
            else if (iVar13 == iVar12) {
              if (b->end <= iter->pos) goto LAB_00141988;
              if ((iVar13 == iVar12) && (b->beg <= iter->pos)) {
                iVar13 = iter->max_plp;
                if (iVar25 == iVar13) {
                  iVar12 = iVar13 * 2;
                  if (iVar13 == 0) {
                    iVar12 = 0x100;
                  }
                  iter->max_plp = iVar12;
                  pbVar11 = (bam_pileup1_t *)realloc(iter->plp,(long)iVar12 * 0x18);
                  iter->plp = pbVar11;
                }
                pbVar11 = iter->plp;
                pbVar11[iVar25].b = &b->b;
                iVar13 = iter->pos;
                uVar21 = *(ulong *)&(b->b).core.field_0x8;
                puVar6 = (b->b).data;
                uVar14 = uVar21 >> 0x18 & 0xff;
                puVar2 = (uint *)(puVar6 + uVar14);
                iVar12 = (b->s).k;
                lVar20 = (long)iVar12;
                if (lVar20 == -1) {
                  if ((uVar21 & 0xffff000000000000) == 0x1000000000000) {
                    if (((*puVar2 & 0xf) < 9) && ((0x181U >> (*puVar2 & 0xf) & 1) != 0)) {
                      (b->s).k = 0;
                      (b->s).x = (b->b).core.pos;
                      (b->s).y = 0;
                    }
                  }
                  else {
                    (b->s).x = (b->b).core.pos;
                    (b->s).y = 0;
                    uVar22 = 0;
                    if (0xffffffffffff < uVar21) {
                      piVar1 = &(b->s).y;
                      uVar22 = 0;
                      do {
                        uVar23 = puVar2[uVar22];
                        if (((uVar23 & 0xd) == 0) ||
                           (uVar24 = uVar23 & 0xf, 0xfffffffd < uVar24 - 9)) break;
                        piVar18 = piVar1;
                        if ((uVar24 == 4) ||
                           ((piVar18 = &(b->s).x, uVar24 == 3 || (piVar18 = piVar1, uVar24 == 1))))
                        {
                          *piVar18 = *piVar18 + (uVar23 >> 4);
                        }
                        uVar22 = uVar22 + 1;
                      } while (uVar22 < *(ushort *)&(b->b).core.field_0xe);
                    }
                    if ((uint)*(ushort *)&(b->b).core.field_0xe <= (uint)uVar22) {
                      __assert_fail("k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x550,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                    (b->s).k = (uint)uVar22;
                  }
                }
                else {
                  uVar23 = puVar2[lVar20] >> 4;
                  iVar4 = (b->s).x;
                  if ((int)uVar23 <= iVar13 - iVar4) {
                    if ((int)(uint)(ushort)(uVar21 >> 0x30) <= iVar12) {
                      __assert_fail("s->k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x556,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                    uVar24 = puVar2[lVar20 + 1];
                    uVar16 = puVar2[lVar20] & 0xf;
                    if ((((uVar24 & 0xf) == 8) || ((uVar24 & 0xd) == 0)) || ((uVar24 & 0xb) == 3)) {
                      if ((uVar16 < 9) && ((0x181U >> uVar16 & 1) != 0)) {
                        piVar1 = &(b->s).y;
                        *piVar1 = *piVar1 + uVar23;
                      }
                      (b->s).x = iVar4 + uVar23;
                      uVar21 = (ulong)(iVar12 + 1);
                    }
                    else {
                      if ((uVar16 < 9) && ((0x181U >> uVar16 & 1) != 0)) {
                        piVar1 = &(b->s).y;
                        *piVar1 = *piVar1 + uVar23;
                      }
                      (b->s).x = iVar4 + uVar23;
                      uVar21 = lVar20 + 1;
                      if ((int)uVar21 < (int)(uint)*(ushort *)&(b->b).core.field_0xe) {
                        do {
                          uVar23 = puVar2[uVar21];
                          uVar24 = uVar23 & 0xf;
                          if (((uVar24 == 8) || ((uVar23 & 0xd) == 0)) || ((uVar23 & 0xb) == 3))
                          break;
                          if ((uVar24 == 4) || (uVar24 == 1)) {
                            piVar1 = &(b->s).y;
                            *piVar1 = *piVar1 + (uVar23 >> 4);
                          }
                          uVar21 = uVar21 + 1;
                        } while ((long)uVar21 < (long)(ulong)*(ushort *)&(b->b).core.field_0xe);
                      }
                    }
                    (b->s).k = (int)uVar21;
                    if ((int)(uint)*(ushort *)&(b->b).core.field_0xe <= (int)uVar21) {
                      __assert_fail("s->k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x566,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                  }
                }
                uVar23 = puVar2[(b->s).k];
                uVar24 = *(uint *)&pbVar11[iVar25].field_0x14;
                pbVar11[iVar25].indel = 0;
                uVar24 = uVar24 & 0xfffffff6;
                *(uint *)&pbVar11[iVar25].field_0x14 = uVar24;
                iVar12 = (b->s).x;
                if ((uVar23 >> 4) + iVar12 + -1 == iVar13) {
                  iVar4 = (b->s).k;
                  uVar3 = *(ushort *)&(b->b).core.field_0xe;
                  if (iVar4 + 1 < (int)(uint)uVar3) {
                    uVar16 = puVar2[(long)iVar4 + 1] & 0xf;
                    uVar19 = puVar2[(long)iVar4 + 1] >> 4;
                    if (uVar16 == 1) {
LAB_00141d1d:
                      pbVar11[iVar25].indel = uVar19;
                    }
                    else if (uVar16 == 6) {
                      lVar20 = (long)iVar4 + 2;
                      if ((int)lVar20 < (int)(uint)uVar3) {
                        lVar15 = 0;
                        uVar19 = 0;
                        do {
                          uVar16 = *(uint *)(puVar6 + lVar15 * 4 + uVar14 + lVar20 * 4);
                          if ((uVar16 & 0xf) == 1) {
                            uVar19 = uVar19 + (uVar16 >> 4);
                          }
                          else if ((((uVar16 & 0xf) == 8) || ((uVar16 & 0xd) == 0)) ||
                                  ((uVar16 & 0xb) == 3)) break;
                          lVar15 = lVar15 + 1;
                        } while (((uint)uVar3 - iVar4) + -2 != (int)lVar15);
                        if (0 < (int)uVar19) goto LAB_00141d1d;
                      }
                    }
                    else if (uVar16 == 2) {
                      uVar19 = -uVar19;
                      goto LAB_00141d1d;
                    }
                  }
                }
                if ((uVar23 & 7) == 0 || (uVar23 & 0xf) == 7) {
                  pbVar11[iVar25].qpos = (iVar13 - iVar12) + (b->s).y;
                }
                else if ((uVar23 & 0xe) == 2) {
                  *(uint *)&pbVar11[iVar25].field_0x14 = uVar24 | 1;
                  pbVar11[iVar25].qpos = (b->s).y;
                  *(uint *)&pbVar11[iVar25].field_0x14 =
                       uVar24 + (uint)((uVar23 & 0xf) == 3) * 8 + 1;
                }
                uVar23 = (*(uint *)&pbVar11[iVar25].field_0x14 & 0xfffffffd) +
                         (uint)((b->b).core.pos == iVar13) * 2;
                *(uint *)&pbVar11[iVar25].field_0x14 = uVar23;
                *(uint *)&pbVar11[iVar25].field_0x14 =
                     (uVar23 & 0xfffffffb) + (uint)((b->s).end == iVar13) * 4;
                iVar25 = iVar25 + 1;
              }
            }
            plVar17 = b;
            b = plVar17->next;
          } while (b->next != (__linkbuf_t *)0x0);
        }
        p_Var7 = iter->dummy->next;
        iter->head = p_Var7;
        *_n_plp = iVar25;
        *_tid = iter->tid;
        *_pos = iter->pos;
        p_Var8 = p_Var7->next;
        if ((p_Var8 == (__linkbuf_t *)0x0) || (iter->tid <= (p_Var7->b).core.tid)) {
          iVar13 = (p_Var7->b).core.tid;
          if (iter->tid < iVar13) {
            iter->tid = iVar13;
            iVar13 = p_Var7->beg;
          }
          else {
            iVar13 = iter->pos + 1;
            if (iter->pos < p_Var7->beg) {
              iVar13 = p_Var7->beg;
            }
          }
          iter->pos = iVar13;
          if (iVar25 == 0) {
            cVar9 = (iter->is_eof != 0) * '\x03';
            if (p_Var8 != (__linkbuf_t *)0x0) {
              cVar9 = '\0';
            }
          }
          else {
            local_50 = iter->plp;
            cVar9 = '\x01';
          }
        }
        else {
          fprintf(_stderr,"[%s] unsorted input. Pileup aborts.\n","bam_plp_next");
          iter->error = 1;
          *_n_plp = -1;
          cVar9 = '\x01';
          local_50 = (bam_pileup1_t *)0x0;
        }
      } while (cVar9 == '\0');
      if (cVar9 != '\x03') {
        return local_50;
      }
    }
  }
  else {
    *_n_plp = -1;
  }
  return (bam_pileup1_t *)0x0;
}

Assistant:

const bam_pileup1_t *bam_plp_next(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    if (iter->error) { *_n_plp = -1; return 0; }
    *_n_plp = 0;
    if (iter->is_eof && iter->head->next == 0) return 0;
    while (iter->is_eof || iter->max_tid > iter->tid || (iter->max_tid == iter->tid && iter->max_pos > iter->pos)) {
        int n_plp = 0;
        lbnode_t *p, *q;
        // write iter->plp at iter->pos
        iter->dummy->next = iter->head;
        for (p = iter->head, q = iter->dummy; p->next; q = p, p = p->next) {
            if (p->b.core.tid < iter->tid || (p->b.core.tid == iter->tid && p->end <= iter->pos)) { // then remove
                overlap_remove(iter, &p->b);
                q->next = p->next; mp_free(iter->mp, p); p = q;
            } else if (p->b.core.tid == iter->tid && p->beg <= iter->pos) { // here: p->end > pos; then add to pileup
                if (n_plp == iter->max_plp) { // then double the capacity
                    iter->max_plp = iter->max_plp? iter->max_plp<<1 : 256;
                    iter->plp = (bam_pileup1_t*)realloc(iter->plp, sizeof(bam_pileup1_t) * iter->max_plp);
                }
                iter->plp[n_plp].b = &p->b;
                if (resolve_cigar2(iter->plp + n_plp, iter->pos, &p->s)) ++n_plp; // actually always true...
            }
        }
        iter->head = iter->dummy->next; // dummy->next may be changed
        *_n_plp = n_plp; *_tid = iter->tid; *_pos = iter->pos;
        // update iter->tid and iter->pos
        if (iter->head->next) {
            if (iter->tid > iter->head->b.core.tid) {
                fprintf(stderr, "[%s] unsorted input. Pileup aborts.\n", __func__);
                iter->error = 1;
                *_n_plp = -1;
                return 0;
            }
        }
        if (iter->tid < iter->head->b.core.tid) { // come to a new reference sequence
            iter->tid = iter->head->b.core.tid; iter->pos = iter->head->beg; // jump to the next reference
        } else if (iter->pos < iter->head->beg) { // here: tid == head->b.core.tid
            iter->pos = iter->head->beg; // jump to the next position
        } else ++iter->pos; // scan contiguously
        // return
        if (n_plp) return iter->plp;
        if (iter->is_eof && iter->head->next == 0) break;
    }
    return 0;
}